

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineChart.cpp
# Opt level: O2

void __thiscall chart::createWindow(chart *this,uint x,uint y,string *des)

{
  RenderTarget *this_00;
  Text *this_01;
  locale alStack_78 [8];
  undefined1 local_70 [12];
  float local_64;
  VideoMode local_50;
  ContextSettings local_44;
  
  local_44.depthBits = 0;
  local_44.stencilBits = 0;
  local_44.antialiasingLevel = 3;
  local_44.majorVersion = 1;
  local_44.minorVersion = 1;
  local_44.attributeFlags = 0;
  local_44.sRgbCapable = false;
  sf::VideoMode::VideoMode(&local_50,x,y,0x20);
  std::locale::locale(alStack_78);
  sf::String::String((String *)local_70,des,alStack_78);
  sf::Window::create((Window *)this,local_50,(String *)local_70,1,&local_44);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_70);
  std::locale::~locale(alStack_78);
  local_70._8_4_ = (undefined4)x;
  local_64 = (float)y;
  local_70._0_8_ = (pointer)0xc1a00000;
  sf::View::reset(&this->view,(FloatRect *)local_70);
  this_00 = &(this->window).super_RenderTarget;
  sf::RenderTarget::setView(this_00,&this->view);
  sf::RenderTarget::clear(this_00,(Color *)&sf::Color::Black);
  sf::Window::display((Window *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"Roboto-Regular.ttf",(allocator<char> *)alStack_78);
  sf::Font::loadFromFile(&this->font,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  this_01 = &this->text;
  sf::Text::setFont(this_01,&this->font);
  std::locale::locale(alStack_78);
  sf::String::String((String *)local_70,"0",alStack_78);
  sf::Text::setString(this_01,(String *)local_70);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_70);
  std::locale::~locale(alStack_78);
  sf::Text::setCharacterSize(this_01,0xe);
  sf::Text::setFillColor(this_01,(Color *)&sf::Color::White);
  return;
}

Assistant:

void chart::createWindow(unsigned x, unsigned y, std::string des)
{
    sf::ContextSettings settings;
    settings.antialiasingLevel = 3;

    window.create(sf::VideoMode(x, y), des, sf::Style::Default || sf::Style::Close, settings);
    view.reset(sf::FloatRect(-20, 0, x, y));
    window.setView(view);

    window.clear(sf::Color::Black);
    window.display();

    font.loadFromFile("Roboto-Regular.ttf");
    text.setFont(font);
    text.setString("0");
    text.setCharacterSize(14);
    text.setFillColor(sf::Color::White);
}